

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall LLVMBC::ModuleParseContext::add_successor(ModuleParseContext *this,BasicBlock *bb)

{
  BasicBlock *this_00;
  LoggingCallback p_Var1;
  void *pvVar2;
  char buffer [4096];
  char local_1018 [4096];
  
  this_00 = this->current_bb;
  if (this_00 == (BasicBlock *)0x0) {
    p_Var1 = ::dxil_spv::get_thread_log_callback();
    if (p_Var1 == (LoggingCallback)0x0) {
      add_successor();
    }
    else {
      builtin_strncpy(local_1018 + 0x20,"successor().\n",0xe);
      builtin_strncpy(local_1018 + 0x10,"s active in add_",0x10);
      builtin_strncpy(local_1018,"No basic block i",0x10);
      pvVar2 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var1)(pvVar2,Error,local_1018);
    }
  }
  else {
    BasicBlock::add_successor(this_00,bb);
  }
  return this_00 != (BasicBlock *)0x0;
}

Assistant:

bool ModuleParseContext::add_successor(BasicBlock *bb)
{
	if (!current_bb)
	{
		LOGE("No basic block is active in add_successor().\n");
		return false;
	}

	current_bb->add_successor(bb);
	return true;
}